

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O0

void __thiscall BPlusTree::PrintNodeWithoutPtr(BPlusTree *this,shared_ptr<Node> *node)

{
  element_type *peVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *this_00;
  int local_1c;
  int i;
  shared_ptr<Node> *node_local;
  BPlusTree *this_local;
  
  std::operator<<((ostream *)&std::cout,"[");
  local_1c = 0;
  while( true ) {
    peVar1 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    sVar2 = std::vector<float,_std::allocator<float>_>::size(&peVar1->keys);
    if (sVar2 <= (ulong)(long)local_1c) break;
    peVar1 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&peVar1->keys,(long)local_1c);
    std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
    peVar1 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    sVar2 = std::vector<float,_std::allocator<float>_>::size(&peVar1->keys);
    if ((long)local_1c != sVar2 - 1) {
      std::operator<<((ostream *)&std::cout," | ");
    }
    local_1c = local_1c + 1;
  }
  this_00 = std::operator<<((ostream *)&std::cout,"]");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BPlusTree::PrintNodeWithoutPtr(std::shared_ptr<Node> node) {
    std::cout << "[";
    for (int i = 0; i < node->keys.size(); i++) {
        std::cout << node->keys[i];
        if (i != node->keys.size() - 1) {
            std::cout << " | ";
        }
    }
    std::cout << "]" << std::endl;
}